

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assembly.cpp
# Opt level: O1

void activeInfo(BasicBlock *block)

{
  pointer pcVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  pointer pQVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  uVar3 = (int)((ulong)((long)(block->block).
                              super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(block->block).
                             super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3) * -0xf0f0f0f - 1;
  if (-1 < (int)uVar3) {
    lVar7 = (ulong)uVar3 * 0x88;
    lVar4 = (ulong)uVar3 + 1;
    do {
      pQVar5 = (block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = *(long *)((long)&(pQVar5->op)._M_dataplus + lVar7);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,lVar9,
                 *(long *)((long)&(pQVar5->op)._M_string_length + lVar7) + lVar9);
      bVar2 = isOperator(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (bVar2) {
        pQVar5 = (block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar9 = *(long *)((long)&(pQVar5->res)._M_dataplus + lVar7);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,lVar9,
                   *(long *)((long)&(pQVar5->res)._M_string_length + lVar7) + lVar9);
        local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
        pcVar1 = (block->curFun)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3b0,pcVar1,pcVar1 + (block->curFun)._M_string_length);
        pQVar5 = (block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
        lVar9 = *(long *)((long)&(pQVar5->res)._M_dataplus + lVar7);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3d0,lVar9,
                   *(long *)((long)&(pQVar5->res)._M_string_length + lVar7) + lVar9);
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        pcVar1 = (block->curFun)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2d0,pcVar1,pcVar1 + (block->curFun)._M_string_length);
        bVar2 = isTempName(&local_3d0,&local_2d0);
        setActive(&local_70,&local_3b0,!bVar2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
          operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
          operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        pQVar5 = (block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        lVar9 = *(long *)((long)&(pQVar5->name1)._M_dataplus + lVar7);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f0,lVar9,
                   *(long *)((long)&(pQVar5->name1)._M_string_length + lVar7) + lVar9);
        local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
        pcVar1 = (block->curFun)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3f0,pcVar1,pcVar1 + (block->curFun)._M_string_length);
        pQVar5 = (block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
        lVar9 = *(long *)((long)&(pQVar5->res)._M_dataplus + lVar7);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_410,lVar9,
                   *(long *)((long)&(pQVar5->res)._M_string_length + lVar7) + lVar9);
        pcVar1 = (block->curFun)._M_dataplus._M_p;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar1,pcVar1 + (block->curFun)._M_string_length);
        bVar2 = isTempName(&local_410,&local_90);
        setActive(&local_2f0,&local_3f0,!bVar2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
          operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        pQVar5 = (block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        lVar9 = *(long *)((long)&(pQVar5->name2)._M_dataplus + lVar7);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_310,lVar9,
                   *(long *)((long)&(pQVar5->name2)._M_string_length + lVar7) + lVar9);
        local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
        pcVar1 = (block->curFun)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_430,pcVar1,pcVar1 + (block->curFun)._M_string_length);
        pQVar5 = (block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
        lVar9 = *(long *)((long)&(pQVar5->res)._M_dataplus + lVar7);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_450,lVar9,
                   *(long *)((long)&(pQVar5->res)._M_string_length + lVar7) + lVar9);
        pcVar1 = (block->curFun)._M_dataplus._M_p;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar1,pcVar1 + (block->curFun)._M_string_length);
        bVar2 = isTempName(&local_450,&local_b0);
        setActive(&local_310,&local_430,!bVar2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != &local_450.field_2) {
          operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_dataplus._M_p != &local_430.field_2) {
          operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
      }
      lVar7 = lVar7 + -0x88;
      lVar9 = lVar4 + -1;
      bVar2 = 0 < lVar4;
      lVar4 = lVar9;
    } while (lVar9 != 0 && bVar2);
  }
  uVar3 = (int)((ulong)((long)(block->block).
                              super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(block->block).
                             super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3) * -0xf0f0f0f - 1;
  if (-1 < (int)uVar3) {
    lVar7 = (ulong)uVar3 * 0x88;
    lVar4 = (ulong)uVar3 + 1;
    do {
      pQVar5 = (block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = *(long *)((long)&(pQVar5->op)._M_dataplus + lVar7);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,lVar9,
                 *(long *)((long)&(pQVar5->op)._M_string_length + lVar7) + lVar9);
      bVar2 = isOperator(&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (bVar2) {
        pQVar5 = (block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
        lVar9 = *(long *)((long)&(pQVar5->res)._M_dataplus + lVar7);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_330,lVar9,
                   *(long *)((long)&(pQVar5->res)._M_string_length + lVar7) + lVar9);
        pcVar1 = (block->curFun)._M_dataplus._M_p;
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,pcVar1,pcVar1 + (block->curFun)._M_string_length);
        bVar2 = isActive(&local_330,&local_f0);
        (&((block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
           super__Vector_impl_data._M_start)->resAct)[lVar7] = bVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != &local_330.field_2) {
          operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
        }
        pQVar5 = (block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        lVar9 = *(long *)((long)&(pQVar5->res)._M_dataplus + lVar7);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d0,lVar9,
                   *(long *)((long)&(pQVar5->res)._M_string_length + lVar7) + lVar9);
        pcVar1 = (block->curFun)._M_dataplus._M_p;
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,pcVar1,pcVar1 + (block->curFun)._M_string_length);
        setActive(&local_1d0,&local_110,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        pQVar5 = (block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        lVar9 = *(long *)((long)&(pQVar5->name1)._M_dataplus + lVar7);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f0,lVar9,
                   *(long *)((long)&(pQVar5->name1)._M_string_length + lVar7) + lVar9);
        pcVar1 = (block->curFun)._M_dataplus._M_p;
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,pcVar1,pcVar1 + (block->curFun)._M_string_length);
        bVar2 = isActive(&local_1f0,&local_130);
        (&((block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
           super__Vector_impl_data._M_start)->name1Act)[lVar7] = bVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        pQVar5 = (block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        lVar9 = *(long *)((long)&(pQVar5->name2)._M_dataplus + lVar7);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_210,lVar9,
                   *(long *)((long)&(pQVar5->name2)._M_string_length + lVar7) + lVar9);
        pcVar1 = (block->curFun)._M_dataplus._M_p;
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_150,pcVar1,pcVar1 + (block->curFun)._M_string_length);
        bVar2 = isActive(&local_210,&local_150);
        (&((block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
           super__Vector_impl_data._M_start)->name2Act)[lVar7] = bVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        pQVar5 = (block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        lVar9 = *(long *)((long)&(pQVar5->name1)._M_dataplus + lVar7);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_230,lVar9,
                   *(long *)((long)&(pQVar5->name1)._M_string_length + lVar7) + lVar9);
        pcVar1 = (block->curFun)._M_dataplus._M_p;
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_170,pcVar1,pcVar1 + (block->curFun)._M_string_length);
        setActive(&local_230,&local_170,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        pQVar5 = (block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        lVar9 = *(long *)((long)&(pQVar5->name2)._M_dataplus + lVar7);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_250,lVar9,
                   *(long *)((long)&(pQVar5->name2)._M_string_length + lVar7) + lVar9);
        pcVar1 = (block->curFun)._M_dataplus._M_p;
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_190,pcVar1,pcVar1 + (block->curFun)._M_string_length);
        setActive(&local_250,&local_190,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
      }
      lVar7 = lVar7 + -0x88;
      lVar9 = lVar4 + -1;
      bVar2 = 0 < lVar4;
      lVar4 = lVar9;
    } while (lVar9 != 0 && bVar2);
  }
  pQVar5 = (block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
      super__Vector_impl_data._M_finish != pQVar5) {
    lVar7 = 0;
    uVar8 = 0;
    do {
      lVar4 = *(long *)((long)&(pQVar5->op)._M_dataplus._M_p + lVar7);
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b0,lVar4,
                 *(long *)((long)&(pQVar5->op)._M_string_length + lVar7) + lVar4);
      bVar2 = isOperator(&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      if (bVar2) {
        pQVar5 = (block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        lVar4 = *(long *)((long)&(pQVar5->name1)._M_dataplus + lVar7);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_270,lVar4,
                   *(long *)((long)&(pQVar5->name1)._M_string_length + lVar7) + lVar4);
        local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
        pcVar1 = (block->curFun)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_350,pcVar1,pcVar1 + (block->curFun)._M_string_length);
        setActive(&local_270,&local_350,
                  (&((block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>.
                     _M_impl.super__Vector_impl_data._M_start)->name1Act)[lVar7]);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != &local_350.field_2) {
          operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        pQVar5 = (block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        lVar4 = *(long *)((long)&(pQVar5->name2)._M_dataplus + lVar7);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_290,lVar4,
                   *(long *)((long)&(pQVar5->name2)._M_string_length + lVar7) + lVar4);
        local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
        pcVar1 = (block->curFun)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_370,pcVar1,pcVar1 + (block->curFun)._M_string_length);
        setActive(&local_290,&local_370,
                  (&((block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>.
                     _M_impl.super__Vector_impl_data._M_start)->name2Act)[lVar7]);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
        }
        pQVar5 = (block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        lVar4 = *(long *)((long)&(pQVar5->res)._M_dataplus + lVar7);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2b0,lVar4,
                   *(long *)((long)&(pQVar5->res)._M_string_length + lVar7) + lVar4);
        local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
        pcVar1 = (block->curFun)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_390,pcVar1,pcVar1 + (block->curFun)._M_string_length);
        setActive(&local_2b0,&local_390,
                  (&((block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>.
                     _M_impl.super__Vector_impl_data._M_start)->resAct)[lVar7]);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != &local_390.field_2) {
          operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
      }
      uVar8 = uVar8 + 1;
      pQVar5 = (block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = ((long)(block->block).super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pQVar5 >> 3) *
              -0xf0f0f0f0f0f0f0f;
      lVar7 = lVar7 + 0x88;
    } while (uVar8 <= uVar6 && uVar6 - uVar8 != 0);
  }
  return;
}

Assistant:

void activeInfo(BasicBlock &block)
{
    for(int i = block.block.size() - 1; i >= 0; i--) {
        if(!isOperator(block.block[i].op)) {
            continue;
        }
        setActive(block.block[i].res, block.curFun, !isTempName(block.block[i].res, block.curFun));
        setActive(block.block[i].name1, block.curFun, !isTempName(block.block[i].res, block.curFun));
        setActive(block.block[i].name2, block.curFun, !isTempName(block.block[i].res, block.curFun));
    }

    for(int i = block.block.size() - 1; i >= 0; i--) {
        if(!isOperator(block.block[i].op)) {
            continue;
        }
        block.block[i].resAct = isActive(block.block[i].res, block.curFun);
        setActive(block.block[i].res, block.curFun, false);
        block.block[i].name1Act = isActive(block.block[i].name1, block.curFun);
        block.block[i].name2Act = isActive(block.block[i].name2, block.curFun);
        setActive(block.block[i].name1, block.curFun, true);
        setActive(block.block[i].name2, block.curFun, true);
    }

    //保证符号表内活跃信息和四元式内一致
    for(int i = 0; i < block.block.size(); i++) {
        if(!isOperator(block.block[i].op)) {
            continue;
        }
        setActive(block.block[i].name1, block.curFun, block.block[i].name1Act);
        setActive(block.block[i].name2, block.curFun, block.block[i].name2Act);
        setActive(block.block[i].res, block.curFun, block.block[i].resAct);
    }

}